

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O2

coda_mem_record *
attribute_record_new
          (coda_type_record *definition,coda_xml_product *product,char *el,char **attr,
          int update_definition)

{
  coda_type *pcVar1;
  hashtable *table;
  uint8_t *data;
  int iVar2;
  coda_mem_record *type;
  char *pcVar3;
  long lVar4;
  coda_mem_data *field_type;
  char *name;
  size_t length;
  coda_type_text *pcVar5;
  long index;
  uint uVar6;
  ulong uVar7;
  char **ppcVar8;
  char *real_name;
  
  if (definition->is_union != 0) {
    pcVar3 = "!definition->is_union";
    uVar6 = 0x62;
LAB_00160c10:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,uVar6,
                  "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                 );
  }
  type = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
  pcVar3 = coda_element_name_from_xml_name(el);
  if (pcVar3 == el) {
LAB_00160a1a:
    for (ppcVar8 = attr + 1; pcVar3 = ppcVar8[-1], pcVar3 != (char *)0x0; ppcVar8 = ppcVar8 + 2) {
      lVar4 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,pcVar3);
      uVar6 = (uint)lVar4;
      if ((int)uVar6 < 0) {
        table = definition->real_name_hash_data;
        name = coda_element_name_from_xml_name(pcVar3);
        lVar4 = coda_hashtable_get_index_from_name(table,name);
        uVar6 = (uint)lVar4;
        if (-1 < (int)uVar6) {
          pcVar3 = coda_element_name_from_xml_name(pcVar3);
        }
      }
      if (update_definition == 0) {
        if (uVar6 == 0xffffffff) {
          coda_set_error(-300,"xml attribute \'%s\' is not allowed",ppcVar8[-1]);
          goto LAB_00160b99;
        }
        pcVar1 = definition->field[(int)uVar6]->type;
        data = (uint8_t *)*ppcVar8;
        length = strlen((char *)data);
        field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                       length,data);
LAB_00160aee:
        iVar2 = 0;
LAB_00160b2b:
        if (field_type == (coda_mem_data *)0x0) goto LAB_00160b99;
        iVar2 = coda_mem_record_add_field(type,pcVar3,(coda_dynamic_type *)field_type,iVar2);
        if (iVar2 != 0) goto LAB_00160b91;
      }
      else {
        if ((int)uVar6 < 0) {
          pcVar5 = coda_type_text_new(coda_format_xml);
          if (pcVar5 != (coda_type_text *)0x0) {
            field_type = coda_mem_string_new(pcVar5,(coda_dynamic_type *)0x0,(coda_product *)product
                                             ,*ppcVar8);
            coda_type_release((coda_type *)pcVar5);
            iVar2 = update_definition;
            goto LAB_00160b2b;
          }
          goto LAB_00160b99;
        }
        if (type->field_type[uVar6] == (coda_dynamic_type *)0x0) {
          field_type = coda_mem_string_new((coda_type_text *)definition->field[uVar6]->type,
                                           (coda_dynamic_type *)0x0,(coda_product *)product,*ppcVar8
                                          );
          goto LAB_00160aee;
        }
      }
    }
    index = 0;
    lVar4 = definition->num_fields;
    if (definition->num_fields < 1) {
      lVar4 = index;
    }
    for (; lVar4 != index; index = index + 1) {
      if ((definition->field[index]->optional == '\0') &&
         (type->field_type[index] == (coda_dynamic_type *)0x0)) {
        if (update_definition == 0) {
          coda_type_get_record_field_real_name((coda_type *)definition,index,&real_name);
          coda_set_error(-300,"mandatory xml attribute \'%s\' is missing",real_name);
          goto LAB_00160b99;
        }
        definition->field[index]->optional = '\x01';
      }
    }
  }
  else {
    lVar4 = coda_hashtable_get_index_from_name(definition->real_name_hash_data,"xmlns");
    uVar7 = ~(ulong)el;
    uVar6 = (uint)lVar4;
    if (update_definition == 0) {
      if ((int)uVar6 < 0) goto LAB_00160a1a;
      pcVar1 = definition->field[uVar6 & 0x7fffffff]->type;
      pcVar3 = coda_element_name_from_xml_name(el);
      field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                     (long)(pcVar3 + uVar7),(uint8_t *)el);
      if (field_type == (coda_mem_data *)0x0) goto LAB_00160b99;
      iVar2 = 0;
LAB_00160a09:
      iVar2 = coda_mem_record_add_field(type,"xmlns",(coda_dynamic_type *)field_type,iVar2);
      if (iVar2 == 0) goto LAB_00160a1a;
LAB_00160b91:
      coda_dynamic_type_delete((coda_dynamic_type *)field_type);
    }
    else if ((int)uVar6 < 0) {
      pcVar5 = coda_type_text_new(coda_format_xml);
      if (pcVar5 != (coda_type_text *)0x0) {
        pcVar3 = coda_element_name_from_xml_name(el);
        field_type = coda_mem_data_new((coda_type *)pcVar5,(coda_dynamic_type *)0x0,
                                       (coda_product *)product,(long)(pcVar3 + uVar7),(uint8_t *)el)
        ;
        coda_type_release((coda_type *)pcVar5);
        iVar2 = update_definition;
        goto LAB_001609ee;
      }
    }
    else {
      if (type->field_type[uVar6 & 0x7fffffff] != (coda_dynamic_type *)0x0) {
        pcVar3 = "attributes->field_type[attribute_index] == NULL";
        uVar6 = 0x7c;
        goto LAB_00160c10;
      }
      pcVar1 = definition->field[uVar6 & 0x7fffffff]->type;
      pcVar3 = coda_element_name_from_xml_name(el);
      field_type = coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)product,
                                     (long)(pcVar3 + uVar7),(uint8_t *)el);
      iVar2 = 0;
LAB_001609ee:
      if (field_type != (coda_mem_data *)0x0) goto LAB_00160a09;
    }
LAB_00160b99:
    coda_dynamic_type_delete((coda_dynamic_type *)type);
    type = (coda_mem_record *)0x0;
  }
  return type;
}

Assistant:

static coda_mem_record *attribute_record_new(coda_type_record *definition, coda_xml_product *product, const char *el,
                                             const char **attr, int update_definition)
{
    coda_mem_record *attributes;
    coda_mem_data *attribute;
    int update_mem_record = update_definition;
    int attribute_index;
    int i;

    assert(definition != NULL);
    assert(!definition->is_union);
    attributes = coda_mem_record_new(definition, NULL);

    if (el != coda_element_name_from_xml_name(el))
    {
        /* store the namespace part of the full xml name as an 'xmlns' attribute */
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, "xmlns");
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_data_new((coda_type *)attribute_definition, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                coda_type_release((coda_type *)attribute_definition);
            }
            else
            {
                assert(attributes->field_type[attribute_index] == NULL);
                attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                update_mem_record = 0;
            }
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
        else if (attribute_index >= 0)
        {
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)(coda_element_name_from_xml_name(el) - el - 1), (const uint8_t *)el);
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    /* add attributes to attribute list */
    for (i = 0; attr[2 * i] != NULL; i++)
    {
        const char *real_name = attr[2 * i];

        update_mem_record = update_definition;
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, real_name);
        if (attribute_index < 0)
        {
            attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data,
                                                            coda_element_name_from_xml_name(real_name));
            if (attribute_index >= 0)
            {
                real_name = coda_element_name_from_xml_name(real_name);
            }
        }
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_string_new(attribute_definition, NULL, (coda_product *)product, attr[2 * i + 1]);
                coda_type_release((coda_type *)attribute_definition);
            }
            else if (attributes->field_type[attribute_index] != NULL)
            {
                /* we only add the first occurrence when there are multiple attributes with the same attribute name */
                continue;
            }
            else
            {
                attribute = coda_mem_string_new((coda_type_text *)definition->field[attribute_index]->type, NULL,
                                                (coda_product *)product, attr[2 * i + 1]);
                update_mem_record = 0;
            }
        }
        else
        {
            if (attribute_index == -1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[2 * i]);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)strlen(attr[2 * i + 1]), (uint8_t *)attr[2 * i + 1]);
        }
        if (attribute == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }

        if (coda_mem_record_add_field(attributes, real_name, (coda_dynamic_type *)attribute, update_mem_record) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attribute);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }
    }

    for (i = 0; i < definition->num_fields; i++)
    {
        if (!definition->field[i]->optional && attributes->field_type[i] == NULL)
        {
            if (update_definition)
            {
                definition->field[i]->optional = 1;
            }
            else
            {
                const char *real_name;

                coda_type_get_record_field_real_name((coda_type *)definition, i, &real_name);
                coda_set_error(CODA_ERROR_PRODUCT, "mandatory xml attribute '%s' is missing", real_name);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    return attributes;
}